

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sVertexArrayTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Stress::anon_unknown_1::SingleVertexArrayOffsetGroup::init
          (SingleVertexArrayOffsetGroup *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
  *pvVar1;
  InputType type;
  GLValue max_;
  int iVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  MultiVertexArrayTest *this_00;
  int iVar6;
  long *plVar7;
  ulong *puVar8;
  int **ppiVar9;
  ulong uVar10;
  int *piVar11;
  undefined8 uVar12;
  InputType IVar13;
  bool bVar14;
  GLValue GVar15;
  Spec spec;
  string name;
  ArraySpec arraySpec;
  undefined1 local_198 [16];
  pointer local_188;
  pointer pAStack_180;
  pointer local_178;
  long local_170;
  long local_168;
  ulong *local_160;
  long local_158;
  ulong local_150;
  long lStack_148;
  int local_140;
  int local_13c;
  long *local_138;
  undefined8 local_130;
  long local_128;
  undefined8 uStack_120;
  string local_118;
  string local_f8;
  long local_d8;
  undefined1 local_d0 [16];
  int *local_c0;
  long lStack_b8;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  InputType local_50;
  undefined4 uStack_4c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_48;
  InputType local_40;
  undefined4 uStack_3c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_38;
  
  local_170 = 0;
  do {
    local_168 = 0;
    do {
      local_d8 = 0;
      do {
        IVar13 = this->m_type & ~INPUTTYPE_FIXED;
        if (local_d8 == 0) {
          iVar2 = deqp::gls::Array::inputTypeSize(this->m_type);
          iVar2 = iVar2 << (IVar13 == INPUTTYPE_UNSIGNED_INT_2_10_10_10) + 1;
        }
        else {
          iVar2 = *(int *)((long)&DAT_01c76278 + local_d8);
        }
        iVar3 = deqp::gls::Array::inputTypeSize(this->m_type);
        iVar6 = iVar3 * 4;
        if (IVar13 != INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
          iVar6 = iVar3;
        }
        if (iVar2 % iVar6 == 0) {
          bVar14 = *(int *)(&DAT_01c0f690 + local_170 * 4) % iVar6 == 0;
        }
        else {
          bVar14 = false;
        }
        local_140 = *(int *)(&DAT_01c0f690 + local_170 * 4);
        local_13c = iVar2;
        typeToString<int>(&local_70,local_140);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1c96fd2);
        plVar7 = plVar4 + 2;
        if ((long *)*plVar4 == plVar7) {
          local_80 = *plVar7;
          lStack_78 = plVar4[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar7;
          local_90 = (long *)*plVar4;
        }
        local_88 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_160 = &local_150;
        puVar8 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar8) {
          local_150 = *puVar8;
          lStack_148 = plVar4[3];
        }
        else {
          local_150 = *puVar8;
          local_160 = (ulong *)*plVar4;
        }
        local_158 = plVar4[1];
        *plVar4 = (long)puVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        typeToString<int>(&local_f8,*(int *)((long)&DAT_01c76278 + local_d8));
        uVar10 = 0xf;
        if (local_160 != &local_150) {
          uVar10 = local_150;
        }
        if (uVar10 < local_f8._M_string_length + local_158) {
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            uVar12 = local_f8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < local_f8._M_string_length + local_158) goto LAB_013c47c2;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_160);
        }
        else {
LAB_013c47c2:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_160,(ulong)local_f8._M_dataplus._M_p);
        }
        pvVar1 = (vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                  *)(puVar5 + 2);
        if ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
             *)*puVar5 == pvVar1) {
          local_188 = *(pointer *)pvVar1;
          pAStack_180 = (pointer)puVar5[3];
          local_198._0_8_ =
               (vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                *)&local_188;
        }
        else {
          local_188 = *(pointer *)pvVar1;
          local_198._0_8_ =
               (vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                *)*puVar5;
        }
        local_198._8_8_ = puVar5[1];
        *puVar5 = pvVar1;
        puVar5[1] = 0;
        *pvVar1 = (vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                   )0x0;
        plVar4 = (long *)std::__cxx11::string::append(local_198);
        ppiVar9 = (int **)(plVar4 + 2);
        if ((int **)*plVar4 == ppiVar9) {
          local_c0 = *ppiVar9;
          lStack_b8 = plVar4[3];
          local_d0._0_8_ = &local_c0;
        }
        else {
          local_c0 = *ppiVar9;
          local_d0._0_8_ = (int **)*plVar4;
        }
        local_d0._8_8_ = plVar4[1];
        *plVar4 = (long)ppiVar9;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        iVar2 = (&DAT_01c0f870)[local_168];
        typeToString<int>(&local_118,iVar2);
        piVar11 = (int *)0xf;
        if ((int **)local_d0._0_8_ != &local_c0) {
          piVar11 = local_c0;
        }
        if (piVar11 < (int *)(local_118._M_string_length + local_d0._8_8_)) {
          uVar12 = (int *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            uVar12 = local_118.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < (int *)(local_118._M_string_length + local_d0._8_8_))
          goto LAB_013c4908;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,local_d0._0_8_);
        }
        else {
LAB_013c4908:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append(local_d0,(ulong)local_118._M_dataplus._M_p);
        }
        plVar4 = puVar5 + 2;
        if ((long *)*puVar5 == plVar4) {
          local_128 = *plVar4;
          uStack_120 = puVar5[3];
          local_138 = &local_128;
        }
        else {
          local_128 = *plVar4;
          local_138 = (long *)*puVar5;
        }
        local_130 = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)plVar4 = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if ((int **)local_d0._0_8_ != &local_c0) {
          operator_delete((void *)local_d0._0_8_,(long)local_c0 + 1);
        }
        if ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
             *)local_198._0_8_ !=
            (vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
             *)&local_188) {
          operator_delete((void *)local_198._0_8_,(ulong)((long)&local_188->inputType + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if (local_160 != &local_150) {
          operator_delete(local_160,local_150 + 1);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        type = this->m_type;
        GVar15 = deqp::gls::GLValue::getMinValue(type);
        aStack_38 = GVar15.field_1;
        local_40 = GVar15.type;
        GVar15 = deqp::gls::GLValue::getMaxValue(this->m_type);
        aStack_48 = GVar15.field_1;
        local_50 = GVar15.type;
        max_._4_4_ = uStack_4c;
        max_.type = local_50;
        GVar15._4_4_ = uStack_3c;
        GVar15.type = local_40;
        GVar15.field_1 = aStack_38;
        max_.field_1 = aStack_48;
        deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                  ((ArraySpec *)local_d0,type,OUTPUTTYPE_VEC2,STORAGE_BUFFER,USAGE_DYNAMIC_DRAW,
                   (uint)(IVar13 == INPUTTYPE_UNSIGNED_INT_2_10_10_10) * 2 + 2,local_140,local_13c,
                   false,GVar15,max_);
        local_188 = (pointer)0x0;
        pAStack_180 = (pointer)0x0;
        local_178 = (pointer)0x0;
        local_198._4_4_ = iVar2;
        local_198._0_4_ = PRIMITIVE_TRIANGLES;
        local_198._8_8_ = local_198._8_8_ & 0xffffffff00000000;
        std::
        vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
        ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                  ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                    *)&local_188,(iterator)0x0,(ArraySpec *)local_d0);
        if (!bVar14) {
          this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
          deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                    (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,
                     (Spec *)local_198,(char *)local_138,(char *)local_138);
          tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
        }
        if (local_188 != (pointer)0x0) {
          operator_delete(local_188,(long)local_178 - (long)local_188);
        }
        if (local_138 != &local_128) {
          operator_delete(local_138,local_128 + 1);
        }
        local_d8 = local_d8 + 4;
      } while (local_d8 != 0xc);
      bVar14 = local_168 == 0;
      local_168 = local_168 + 1;
    } while (bVar14);
    local_170 = local_170 + 1;
    if (local_170 == 4) {
      return 4;
    }
  } while( true );
}

Assistant:

void SingleVertexArrayOffsetGroup::init (void)
{
	int					counts[]		= {1, 256};
	int					offsets[]		= {1, 4, 17, 32};
	int					strides[]		= {/*0,*/ -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.

	for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
	{
		for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
		{
			for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
			{
				const bool			packed			= m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10;
				const int			componentCount	= (packed) ? (4) : (2);
				const int			stride			= (strides[strideNdx] < 0 ? Array::inputTypeSize(m_type) * componentCount : strides[strideNdx]);
				const int			alignment		= (packed) ? (Array::inputTypeSize(m_type) * componentCount) : (Array::inputTypeSize(m_type));
				const bool			aligned			= ((stride % alignment) == 0) && ((offsets[offsetNdx] % alignment) == 0);
				const std::string	name			= "offset" + typeToString(offsets[offsetNdx]) + "_stride" + typeToString(strides[strideNdx]) + "_quads" + typeToString(counts[countNdx]);

				MultiVertexArrayTest::Spec::ArraySpec arraySpec(m_type,
																Array::OUTPUTTYPE_VEC2,
																Array::STORAGE_BUFFER,
																Array::USAGE_DYNAMIC_DRAW,
																componentCount,
																offsets[offsetNdx],
																stride,
																false,
																GLValue::getMinValue(m_type),
																GLValue::getMaxValue(m_type));

				MultiVertexArrayTest::Spec spec;
				spec.primitive	= Array::PRIMITIVE_TRIANGLES;
				spec.drawCount	= counts[countNdx];
				spec.first		= 0;
				spec.arrays.push_back(arraySpec);

				if (!aligned)
					addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
			}
		}
	}
}